

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

void Curl_cookie_clearsess(CookieInfo *cookies)

{
  Cookie *pCVar1;
  Cookie *pCVar2;
  Cookie *co;
  Cookie *pCVar3;
  long lVar4;
  Cookie *pCVar5;
  
  if (cookies != (CookieInfo *)0x0) {
    lVar4 = 0;
    do {
      pCVar2 = cookies->cookies[lVar4];
      co = pCVar2;
      pCVar5 = pCVar2;
      if (pCVar2 != (Cookie *)0x0) {
        do {
          pCVar1 = co->next;
          if (co->expires == 0) {
            if (pCVar5 == co) {
              pCVar5 = pCVar1;
            }
            pCVar3 = pCVar1;
            if (pCVar2 != co) {
              pCVar2->next = pCVar1;
              pCVar3 = pCVar2;
            }
            freecookie(co);
            cookies->numcookies = cookies->numcookies + -1;
            co = pCVar3;
          }
          pCVar2 = co;
          co = pCVar1;
        } while (pCVar1 != (Cookie *)0x0);
        cookies->cookies[lVar4] = pCVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
  }
  return;
}

Assistant:

void Curl_cookie_clearsess(struct CookieInfo *cookies)
{
  struct Cookie *first, *curr, *next, *prev = NULL;
  unsigned int i;

  if(!cookies)
    return;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    if(!cookies->cookies[i])
      continue;

    first = curr = prev = cookies->cookies[i];

    for(; curr; curr = next) {
      next = curr->next;
      if(!curr->expires) {
        if(first == curr)
          first = next;

        if(prev == curr)
          prev = next;
        else
          prev->next = next;

        freecookie(curr);
        cookies->numcookies--;
      }
      else
        prev = curr;
    }

    cookies->cookies[i] = first;
  }
}